

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::remove_pass_through_modules(Generator *top)

{
  undefined1 local_a0 [8];
  RemovePassThroughVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a0 = (undefined1  [8])&PTR_visit_root_002b4938;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.pass_through_._M_h._M_rehash_policy._M_next_resize;
  visitor.pass_through_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.pass_through_._M_h._M_bucket_count = 0;
  visitor.pass_through_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.pass_through_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.pass_through_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.pass_through_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.pass_through_._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_generator_root((IRVisitor *)local_a0,top);
  local_a0 = (undefined1  [8])&PTR_visit_root_002b4938;
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_a0 = (undefined1  [8])&PTR_visit_root_002b0dc0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void remove_pass_through_modules(Generator* top) {
    RemovePassThroughVisitor visitor;
    visitor.visit_generator_root(top);
}